

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  sunrealtype p3;
  sunrealtype p2;
  sunrealtype p1;
  UserData data;
  sunrealtype y3;
  sunrealtype y2;
  N_Vector tmp2_local;
  N_Vector tmp1_local;
  void *user_data_local;
  SUNMatrix J_local;
  N_Vector fy_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  uVar3 = *user_data;
  dVar4 = *(double *)((long)user_data + 8);
  dVar5 = *(double *)((long)user_data + 0x10);
  *(ulong *)**(undefined8 **)((long)J->content + 0x20) = uVar3 ^ 0x8000000000000000;
  **(double **)(*(long *)((long)J->content + 0x20) + 8) = dVar4 * dVar2;
  **(double **)(*(long *)((long)J->content + 0x20) + 0x10) = dVar4 * dVar1;
  *(ulong *)(**(long **)((long)J->content + 0x20) + 8) = uVar3;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 8) =
       -dVar4 * dVar2 + -(dVar5 * 2.0 * dVar1);
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x10) + 8) = -dVar4 * dVar1;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 0x10) = dVar5 * 2.0 * dVar1;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype y2, y3;
  UserData data;
  sunrealtype p1, p2, p3;

  y2   = Ith(y, 2);
  y3   = Ith(y, 3);
  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  IJth(J, 1, 1) = -p1;
  IJth(J, 1, 2) = p2 * y3;
  IJth(J, 1, 3) = p2 * y2;
  IJth(J, 2, 1) = p1;
  IJth(J, 2, 2) = -p2 * y3 - 2 * p3 * y2;
  IJth(J, 2, 3) = -p2 * y2;
  IJth(J, 3, 2) = 2 * p3 * y2;

  return (0);
}